

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch_empty<EasyUseMap<HashObject<4,4>,int>>(int iters)

{
  bool bVar1;
  int in_EDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  double ut;
  double in_stack_00000018;
  char *in_stack_00000020;
  int i;
  int r;
  Rusage t;
  EasyUseMap<HashObject<4,_4>,_int> set;
  map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_ffffffffffffff78;
  Rusage *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff90;
  HashObject<4,_4> local_64;
  _Self local_60;
  int local_54;
  uint local_50;
  int local_4;
  
  local_4 = in_EDI;
  EasyUseMap<HashObject<4,_4>,_int>::EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d6228);
  Rusage::Rusage(in_stack_ffffffffffffff80);
  local_50 = 1;
  Rusage::Reset(in_stack_ffffffffffffff80);
  for (local_54 = 0; local_54 < local_4; local_54 = local_54 + 1) {
    HashObject<4,_4>::HashObject(&local_64,local_54);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
         ::find(in_stack_ffffffffffffff78,(key_type *)0x1d627e);
    in_stack_ffffffffffffff90 =
         std::
         map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
         ::end(in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(&local_60,(_Self *)&stack0xffffffffffffff90);
    local_50 = bVar1 ^ local_50;
  }
  Rusage::UserTime((Rusage *)in_stack_ffffffffffffff90._M_node);
  srand(local_50);
  report(in_stack_00000020,in_stack_00000018,ut._4_4_,in_stack_00000008,unaff_retaddr);
  EasyUseMap<HashObject<4,_4>,_int>::~EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d6332);
  return;
}

Assistant:

static void time_map_fetch_empty(int iters) {
  MapType set;
  Rusage t;
  int r;
  int i;

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(i) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report("map_fetch_empty", ut, iters, 0, 0);
}